

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iteratedhash.hpp
# Opt level: O1

void __thiscall
crypto::iterated_hash<crypto::sha1_transform>::finalize
          (iterated_hash<crypto::sha1_transform> *this,char *result)

{
  long lVar1;
  uint uVar2;
  hash_word hVar3;
  uint uVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  size_t i;
  long lVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  hash_word aligned_buffer [16];
  undefined4 local_58;
  char acStack_54 [60];
  
  pad(this,0x38,-0x80);
  uVar2 = this->count_lo;
  hVar3 = this->count_hi;
  uVar4 = uVar2 * 8;
  *(uint *)(this->buffer + 0x3c) =
       uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar2 << 0x1b;
  uVar4 = hVar3 << 3;
  *(uint *)(this->buffer + 0x38) =
       uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
       (uVar4 | uVar2 >> 0x1d) << 0x18;
  lVar31 = 0;
  do {
    auVar32 = *(undefined1 (*) [16])(this->buffer + lVar31 * 4);
    auVar33[1] = 0;
    auVar33[0] = auVar32[8];
    auVar33[2] = auVar32[9];
    auVar33[3] = 0;
    auVar33[4] = auVar32[10];
    auVar33[5] = 0;
    auVar33[6] = auVar32[0xb];
    auVar33[7] = 0;
    auVar33[8] = auVar32[0xc];
    auVar33[9] = 0;
    auVar33[10] = auVar32[0xd];
    auVar33[0xb] = 0;
    auVar33[0xc] = auVar32[0xe];
    auVar33[0xd] = 0;
    auVar33[0xe] = auVar32[0xf];
    auVar33[0xf] = 0;
    auVar33 = pshuflw(auVar33,auVar33,0x1b);
    auVar33 = pshufhw(auVar33,auVar33,0x1b);
    auVar21[0xd] = 0;
    auVar21._0_13_ = auVar32._0_13_;
    auVar21[0xe] = auVar32[7];
    auVar22[0xc] = auVar32[6];
    auVar22._0_12_ = auVar32._0_12_;
    auVar22._13_2_ = auVar21._13_2_;
    auVar23[0xb] = 0;
    auVar23._0_11_ = auVar32._0_11_;
    auVar23._12_3_ = auVar22._12_3_;
    auVar24[10] = auVar32[5];
    auVar24._0_10_ = auVar32._0_10_;
    auVar24._11_4_ = auVar23._11_4_;
    auVar25[9] = 0;
    auVar25._0_9_ = auVar32._0_9_;
    auVar25._10_5_ = auVar24._10_5_;
    auVar26[8] = auVar32[4];
    auVar26._0_8_ = auVar32._0_8_;
    auVar26._9_6_ = auVar25._9_6_;
    auVar28._7_8_ = 0;
    auVar28._0_7_ = auVar26._8_7_;
    auVar29._1_8_ = SUB158(auVar28 << 0x40,7);
    auVar29[0] = auVar32[3];
    auVar29._9_6_ = 0;
    auVar30._1_10_ = SUB1510(auVar29 << 0x30,5);
    auVar30[0] = auVar32[2];
    auVar30._11_4_ = 0;
    auVar27[2] = auVar32[1];
    auVar27._0_2_ = auVar32._0_2_;
    auVar27._3_12_ = SUB1512(auVar30 << 0x20,3);
    auVar32._0_2_ = auVar32._0_2_ & 0xff;
    auVar32._2_13_ = auVar27._2_13_;
    auVar32[0xf] = 0;
    auVar32 = pshuflw(auVar32,auVar32,0x1b);
    auVar32 = pshufhw(auVar32,auVar32,0x1b);
    sVar5 = auVar32._0_2_;
    sVar6 = auVar32._2_2_;
    sVar7 = auVar32._4_2_;
    sVar8 = auVar32._6_2_;
    sVar9 = auVar32._8_2_;
    sVar10 = auVar32._10_2_;
    sVar11 = auVar32._12_2_;
    sVar12 = auVar32._14_2_;
    sVar13 = auVar33._0_2_;
    sVar14 = auVar33._2_2_;
    sVar15 = auVar33._4_2_;
    sVar16 = auVar33._6_2_;
    sVar17 = auVar33._8_2_;
    sVar18 = auVar33._10_2_;
    sVar19 = auVar33._12_2_;
    sVar20 = auVar33._14_2_;
    lVar1 = lVar31 * 4;
    *(char *)(&local_58 + lVar31) = (0 < sVar5) * (sVar5 < 0x100) * auVar32[0] - (0xff < sVar5);
    *(char *)((long)&local_58 + lVar1 + 1) =
         (0 < sVar6) * (sVar6 < 0x100) * auVar32[2] - (0xff < sVar6);
    *(char *)((long)&local_58 + lVar1 + 2) =
         (0 < sVar7) * (sVar7 < 0x100) * auVar32[4] - (0xff < sVar7);
    *(char *)((long)&local_58 + lVar1 + 3) =
         (0 < sVar8) * (sVar8 < 0x100) * auVar32[6] - (0xff < sVar8);
    acStack_54[lVar1] = (0 < sVar9) * (sVar9 < 0x100) * auVar32[8] - (0xff < sVar9);
    acStack_54[lVar1 + 1] = (0 < sVar10) * (sVar10 < 0x100) * auVar32[10] - (0xff < sVar10);
    acStack_54[lVar1 + 2] = (0 < sVar11) * (sVar11 < 0x100) * auVar32[0xc] - (0xff < sVar11);
    acStack_54[lVar1 + 3] = (0 < sVar12) * (sVar12 < 0x100) * auVar32[0xe] - (0xff < sVar12);
    acStack_54[lVar1 + 4] = (0 < sVar13) * (sVar13 < 0x100) * auVar33[0] - (0xff < sVar13);
    acStack_54[lVar1 + 5] = (0 < sVar14) * (sVar14 < 0x100) * auVar33[2] - (0xff < sVar14);
    acStack_54[lVar1 + 6] = (0 < sVar15) * (sVar15 < 0x100) * auVar33[4] - (0xff < sVar15);
    acStack_54[lVar1 + 7] = (0 < sVar16) * (sVar16 < 0x100) * auVar33[6] - (0xff < sVar16);
    acStack_54[lVar1 + 8] = (0 < sVar17) * (sVar17 < 0x100) * auVar33[8] - (0xff < sVar17);
    acStack_54[lVar1 + 9] = (0 < sVar18) * (sVar18 < 0x100) * auVar33[10] - (0xff < sVar18);
    acStack_54[lVar1 + 10] = (0 < sVar19) * (sVar19 < 0x100) * auVar33[0xc] - (0xff < sVar19);
    acStack_54[lVar1 + 0xb] = (0 < sVar20) * (sVar20 < 0x100) * auVar33[0xe] - (0xff < sVar20);
    lVar31 = lVar31 + 4;
  } while (lVar31 != 0x10);
  sha1_transform::transform(this->state,&local_58);
  lVar31 = 0;
  do {
    uVar4 = this->state[lVar31];
    *(uint *)(result + lVar31 * 4) =
         uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    lVar31 = lVar31 + 1;
  } while (lVar31 != 5);
  return;
}

Assistant:

void iterated_hash<T>::finalize(char * result) {
	
	size_t order = transform::offset * sizeof(hash_word);
	
	size_t size = block_size - 2 * sizeof(hash_word);
	pad(size);
	byte_order::store(bit_count_lo(), buffer + size + order);
	byte_order::store(bit_count_hi(), buffer + size + sizeof(hash_word) - order);
	
	hash(state, buffer, block_size);
	
	byte_order::store(state, hash_size, result);
	
}